

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.h
# Opt level: O0

int __thiscall ByteArray::getDoubleWord(ByteArray *this,size_t pos,Endianness endianness)

{
  size_t sVar1;
  byte *pbVar2;
  uchar *d;
  Endianness endianness_local;
  size_t pos_local;
  ByteArray *this_local;
  
  sVar1 = size(this);
  if (pos + 3 < sVar1) {
    pbVar2 = data(this,0);
    if (endianness == Little) {
      this_local._4_4_ =
           CONCAT13(pbVar2[pos + 3],CONCAT12(pbVar2[pos + 2],CONCAT11(pbVar2[pos + 1],pbVar2[pos])))
      ;
    }
    else {
      this_local._4_4_ =
           CONCAT13(pbVar2[pos],CONCAT12(pbVar2[pos + 1],CONCAT11(pbVar2[pos + 2],pbVar2[pos + 3])))
      ;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int getDoubleWord(size_t pos, Endianness endianness = Endianness::Little) const
	{
		if (pos+3 >= this->size()) return -1;
		unsigned char* d = (unsigned char*) this->data();

		if (endianness == Endianness::Little)
		{
			return d[pos+0] | (d[pos+1] << 8) | (d[pos+2] << 16) | (d[pos+3] << 24);
		} else {
			return d[pos+3] | (d[pos+2] << 8) | (d[pos+1] << 16) | (d[pos+0] << 24);
		}
	}